

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_add_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((line->unpacked & 2) == 0) {
    bcf_unpack(line,2);
  }
  uVar4 = (line->d).n_flt;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
  }
  do {
    if (uVar5 == uVar3) {
      piVar2 = &(line->d).shared_dirty;
      *(byte *)piVar2 = (byte)*piVar2 | 4;
      iVar1 = 1;
      if ((flt_id != 0) && ((uVar4 != 1 || (*(line->d).flt != 0)))) {
        iVar1 = uVar4 + 1;
      }
      (line->d).n_flt = iVar1;
      piVar2 = (line->d).flt;
      if ((line->d).m_flt < iVar1) {
        uVar4 = (int)(iVar1 - 1U) >> 1 | iVar1 - 1U;
        uVar4 = (int)uVar4 >> 2 | uVar4;
        uVar4 = (int)uVar4 >> 4 | uVar4;
        uVar4 = (int)uVar4 >> 8 | uVar4;
        uVar4 = (int)uVar4 >> 0x10 | uVar4;
        (line->d).m_flt = uVar4 + 1;
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar4 * 4 + 4);
        (line->d).flt = piVar2;
        iVar1 = (line->d).n_flt;
      }
      piVar2[(long)iVar1 + -1] = flt_id;
      return 1;
    }
    piVar2 = (line->d).flt + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar2 != flt_id);
  return 0;
}

Assistant:

int bcf_add_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i<line->d.n_flt ) return 0;    // this filter is already set
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( flt_id==0 )    // set to PASS
        line->d.n_flt = 1;
    else if ( line->d.n_flt==1 && line->d.flt[0]==0 )
        line->d.n_flt = 1;
    else
        line->d.n_flt++;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    line->d.flt[line->d.n_flt-1] = flt_id;
    return 1;
}